

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall wabt::anon_unknown_15::BinaryReaderObjdump::EndInitExpr(BinaryReaderObjdump *this)

{
  uint64_t *out_offset;
  
  if (this->reading_data_init_expr_ == true) {
    this->reading_data_init_expr_ = false;
    out_offset = &this->data_offset_;
  }
  else {
    if (this->reading_elem_init_expr_ != true) {
      if (this->reading_global_init_expr_ == true) {
        this->reading_global_init_expr_ = false;
        PrintInitExpr(this,&this->current_init_expr_,false);
        return (Result)Ok;
      }
      abort();
    }
    this->reading_elem_init_expr_ = false;
    out_offset = &this->elem_offset_;
  }
  InitExprToConstOffset(&this->current_init_expr_,out_offset);
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::EndInitExpr() {
  if (reading_data_init_expr_) {
    reading_data_init_expr_ = false;
    InitExprToConstOffset(current_init_expr_, &data_offset_);
  } else if (reading_elem_init_expr_) {
    reading_elem_init_expr_ = false;
    InitExprToConstOffset(current_init_expr_, &elem_offset_);
  } else if (reading_global_init_expr_) {
    reading_global_init_expr_ = false;
    PrintInitExpr(current_init_expr_);
  } else {
    WABT_UNREACHABLE;
  }
  return Result::Ok;
}